

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_function_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  ulong uVar4;
  JSContext *pJVar6;
  ulong uVar7;
  long lVar9;
  JSValue obj;
  JSValue func_obj;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue v;
  JSValue this_obj;
  StringBuffer local_70;
  ulong local_50;
  uint local_44;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion JVar5;
  int64_t iVar8;
  
  local_70.len = 0;
  local_70.size = 0;
  local_70.is_wide_char = 0;
  local_70.error_status = 0;
  local_70.ctx = ctx;
  local_70.str = js_alloc_string(ctx,0,0);
  if (local_70.str == (JSString *)0x0) {
    local_70._16_8_ = local_70._16_8_ & 0xffffffff;
    local_70.error_status = -1;
  }
  string_buffer_putc8(&local_70,0x28);
  if ((magic & 0xfffffffeU) == 2) {
    string_buffer_write8(&local_70,(uint8_t *)"async ",6);
  }
  local_40 = new_target.u;
  local_38 = new_target.tag;
  string_buffer_write8(&local_70,"function",8);
  local_44 = magic;
  if ((magic & 0xfffffffdU) == 1) {
    string_buffer_putc8(&local_70,0x2a);
  }
  string_buffer_write8(&local_70,(uint8_t *)" anonymous(",0xb);
  uVar4 = (ulong)(argc - 1);
  local_50 = (ulong)(uint)argc;
  if (1 < argc) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        string_buffer_putc8(&local_70,0x2c);
      }
      JVar10.tag = *(int64_t *)((long)&argv->tag + lVar9);
      JVar10.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar9))->ptr;
      iVar3 = string_buffer_concat_value(&local_70,JVar10);
      if (iVar3 != 0) goto LAB_0010d9f9;
      lVar9 = lVar9 + 0x10;
    } while (uVar4 << 4 != lVar9);
  }
  string_buffer_write8(&local_70,(uint8_t *)"\n) {\n",5);
  if ((int)local_50 < 1) {
LAB_0010da16:
    string_buffer_write8(&local_70,(uint8_t *)"\n})",3);
    JVar10 = string_buffer_end(&local_70);
    if ((uint)JVar10.tag == 6) goto LAB_0010da3e;
    JVar12 = JS_EvalObject(ctx,ctx->global_obj,JVar10,3,-1);
    iVar8 = JVar12.tag;
    if ((0xfffffff4 < (uint)JVar10.tag) &&
       (iVar3 = *JVar10.u.ptr, *(int *)JVar10.u.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    iVar2 = local_38;
    JVar1 = local_40;
    if ((int)JVar12.tag == 6) goto LAB_0010da45;
    if ((int)local_38 == 3) {
LAB_0010dbf0:
      uVar7 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar12.u.ptr & 0xffffffff;
      goto LAB_0010da7f;
    }
    obj.tag = local_38;
    obj.u.ptr = local_40.ptr;
    this_obj.tag = local_38;
    this_obj.u.ptr = local_40.ptr;
    v = JS_GetPropertyInternal(ctx,obj,0x3b,this_obj,0);
    JVar5 = v.u;
    if ((int)v.tag == -1) {
LAB_0010dbbb:
      iVar3 = JS_SetPrototypeInternal(ctx,JVar12,v,1);
      JS_FreeValue(ctx,v);
      if (-1 < iVar3) goto LAB_0010dbf0;
    }
    else if ((int)v.tag != 6) {
      local_50 = v.tag;
      JS_FreeValue(ctx,v);
      func_obj.tag = iVar2;
      func_obj.u.ptr = JVar1.ptr;
      pJVar6 = JS_GetFunctionRealm(ctx,func_obj);
      if (pJVar6 == (JSContext *)0x0) {
        iVar3 = 6;
        uVar4 = local_50;
      }
      else {
        JVar5 = (JSValueUnion)pJVar6->class_proto[func_kind_to_class_id[local_44]].u.ptr;
        uVar4 = pJVar6->class_proto[func_kind_to_class_id[local_44]].tag;
        if (0xfffffff4 < (uint)uVar4) {
          *(int *)JVar5.ptr = *JVar5.ptr + 1;
        }
        iVar3 = 0;
      }
      v.tag = uVar4;
      v.u.ptr = JVar5.ptr;
      if (iVar3 != 6) {
        if (iVar3 != 0) {
          uVar4 = 0;
          uVar7 = 0;
          goto LAB_0010da7f;
        }
        goto LAB_0010dbbb;
      }
    }
  }
  else {
    JVar12.tag = argv[uVar4].tag;
    JVar12.u.ptr = argv[uVar4].u.ptr;
    iVar3 = string_buffer_concat_value(&local_70,JVar12);
    if (iVar3 == 0) goto LAB_0010da16;
LAB_0010d9f9:
    (*((local_70.ctx)->rt->mf).js_free)(&(local_70.ctx)->rt->malloc_state,local_70.str);
    local_70.str = (JSString *)0x0;
LAB_0010da3e:
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
  }
LAB_0010da45:
  if ((0xfffffff4 < (uint)JVar12.tag) &&
     (iVar3 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar12);
  }
  iVar8 = 6;
  uVar4 = 0;
  uVar7 = 0;
LAB_0010da7f:
  JVar11.u.ptr = (void *)(uVar4 | uVar7);
  JVar11.tag = iVar8;
  return JVar11;
}

Assistant:

static JSValue js_function_constructor(JSContext *ctx, JSValueConst new_target,
                                       int argc, JSValueConst *argv, int magic)
{
    JSFunctionKindEnum func_kind = magic;
    int i, n, ret;
    JSValue s, proto, obj = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, 0);
    string_buffer_putc8(b, '(');
    
    if (func_kind == JS_FUNC_ASYNC || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_puts8(b, "async ");
    }
    string_buffer_puts8(b, "function");

    if (func_kind == JS_FUNC_GENERATOR || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_putc8(b, '*');
    }
    string_buffer_puts8(b, " anonymous(");

    n = argc - 1;
    for(i = 0; i < n; i++) {
        if (i != 0) {
            string_buffer_putc8(b, ',');
        }
        if (string_buffer_concat_value(b, argv[i]))
            goto fail;
    }
    string_buffer_puts8(b, "\n) {\n");
    if (n >= 0) {
        if (string_buffer_concat_value(b, argv[n]))
            goto fail;
    }
    string_buffer_puts8(b, "\n})");
    s = string_buffer_end(b);
    if (JS_IsException(s))
        goto fail1;

    obj = JS_EvalObject(ctx, ctx->global_obj, s, JS_EVAL_TYPE_INDIRECT, -1);
    JS_FreeValue(ctx, s);
    if (JS_IsException(obj))
        goto fail1;
    if (!JS_IsUndefined(new_target)) {
        /* set the prototype */
        proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
        if (JS_IsException(proto))
            goto fail1;
        if (!JS_IsObject(proto)) {
            JSContext *realm;
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, new_target);
            if (!realm)
                goto fail1;
            proto = JS_DupValue(ctx, realm->class_proto[func_kind_to_class_id[func_kind]]);
        }
        ret = JS_SetPrototypeInternal(ctx, obj, proto, TRUE);
        JS_FreeValue(ctx, proto);
        if (ret < 0)
            goto fail1;
    }
    return obj;

 fail:
    string_buffer_free(b);
 fail1:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}